

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O1

int Bac_CommandWrite(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Bac_Man_t *p;
  bool bVar1;
  bool bVar2;
  int iVar3;
  Vec_Ptr_t *vDes;
  char *pcVar4;
  char *pcVar5;
  uint fUseAssign;
  
  p = (Bac_Man_t *)pAbc->pAbcBac;
  bVar2 = false;
  Extra_UtilGetoptReset();
  fUseAssign = 1;
  bVar1 = false;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"apvh"), iVar3 == 0x76) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar3 == -1) break;
    if (iVar3 == 0x70) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else {
      if (iVar3 != 0x61) {
        Abc_Print(-2,"usage: @_write [-apvh]\n");
        Abc_Print(-2,"\t         writes the design into a file in BLIF or Verilog\n");
        pcVar5 = "yes";
        pcVar4 = "yes";
        if (fUseAssign == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-a     : toggle using assign-statement for primitives [default = %s]\n",
                  pcVar4);
        pcVar4 = "yes";
        if (!bVar2) {
          pcVar4 = "no";
        }
        Abc_Print(-2,
                  "\t-p     : toggle using Ptr construction (mapped Verilog only) [default = %s]\n",
                  pcVar4);
        if (!bVar1) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      fUseAssign = fUseAssign ^ 1;
    }
  }
  if (p == (Bac_Man_t *)0x0) {
    Abc_Print(1,"Bac_CommandWrite(): There is no current design.\n");
    return 0;
  }
  if (globalUtilOptind + 1 == argc) {
    pcVar4 = argv[globalUtilOptind];
  }
  else {
    if (globalUtilOptind != argc) {
      pcVar4 = "Output file name should be given on the command line.";
      goto LAB_0030c93e;
    }
    pcVar4 = Extra_FileNameGenericAppend(p->pName,"_out.v");
  }
  pcVar5 = Extra_FileNameExtension(pcVar4);
  iVar3 = strcmp(pcVar5,"blif");
  if (iVar3 == 0) {
    Bac_ManWriteBlif(pcVar4,p);
    return 0;
  }
  pcVar5 = Extra_FileNameExtension(pcVar4);
  iVar3 = strcmp(pcVar5,"v");
  if (iVar3 == 0) {
    if (!bVar2) {
      Bac_ManWriteVerilog(pcVar4,p,fUseAssign);
      return 0;
    }
    vDes = Bac_PtrDeriveFromCba(p);
    if (vDes != (Vec_Ptr_t *)0x0) {
      Bac_PtrDumpVerilog(pcVar4,vDes);
      Bac_PtrFree(vDes);
      return 0;
    }
    pcVar4 = "Converting to Ptr has failed.";
  }
  else {
    pcVar5 = Extra_FileNameExtension(pcVar4);
    iVar3 = strcmp(pcVar5,"bac");
    if (iVar3 == 0) {
      Bac_ManWriteBac(pcVar4,p);
      return 0;
    }
    pcVar4 = "Unrecognized output file extension.";
  }
LAB_0030c93e:
  puts(pcVar4);
  return 0;
}

Assistant:

int Bac_CommandWrite( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Bac_Man_t * p = Bac_AbcGetMan(pAbc);
    char * pFileName = NULL;
    int fUseAssign   =    1;
    int fUsePtr      =    0; 
    int c, fVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "apvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fUseAssign ^= 1;
            break;
        case 'p':
            fUsePtr ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Bac_CommandWrite(): There is no current design.\n" );
        return 0;
    }
    if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    else if ( argc == globalUtilOptind && p )
        pFileName = Extra_FileNameGenericAppend( Bac_ManName(p), "_out.v" );
    else 
    {
        printf( "Output file name should be given on the command line.\n" );
        return 0;
    }
    // perform writing
    if ( !strcmp( Extra_FileNameExtension(pFileName), "blif" )  )
        Bac_ManWriteBlif( pFileName, p );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "v" )  )
    {
        if ( fUsePtr )
        {
            Vec_Ptr_t * vPtr = Bac_PtrDeriveFromCba( p );
            if ( vPtr == NULL )
                printf( "Converting to Ptr has failed.\n" );
            else
            {
                Bac_PtrDumpVerilog( pFileName, vPtr );
                Bac_PtrFree( vPtr ); 
            }
        }
        else
            Bac_ManWriteVerilog( pFileName, p, fUseAssign );        
    }
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "bac" )  )
        Bac_ManWriteBac( pFileName, p );
    else 
    {
        printf( "Unrecognized output file extension.\n" );
        return 0;
    }
    return 0;
usage:
    Abc_Print( -2, "usage: @_write [-apvh]\n" );
    Abc_Print( -2, "\t         writes the design into a file in BLIF or Verilog\n" );
    Abc_Print( -2, "\t-a     : toggle using assign-statement for primitives [default = %s]\n",  fUseAssign? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle using Ptr construction (mapped Verilog only) [default = %s]\n", fUsePtr? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}